

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

string * __thiscall
cmCompiledGeneratorExpression::Evaluate
          (cmCompiledGeneratorExpression *this,cmLocalGenerator *lg,string *config,
          cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
          cmGeneratorTarget *currentTarget,string *language)

{
  bool evaluateForBuildsystem;
  bool quiet;
  string *psVar1;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1e0;
  string local_1d0;
  string local_1b0;
  cmGeneratorExpressionContext context;
  
  std::__cxx11::string::string((string *)&local_1b0,(string *)config);
  evaluateForBuildsystem = this->EvaluateForBuildsystem;
  quiet = this->Quiet;
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_1e0,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)this);
  std::__cxx11::string::string((string *)&local_1d0,(string *)language);
  if (currentTarget == (cmGeneratorTarget *)0x0) {
    currentTarget = headTarget;
  }
  cmGeneratorExpressionContext::cmGeneratorExpressionContext
            (&context,lg,&local_1b0,quiet,headTarget,currentTarget,evaluateForBuildsystem,
             (cmListFileBacktrace *)&local_1e0,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
  std::__cxx11::string::~string((string *)&local_1b0);
  psVar1 = EvaluateWithContext_abi_cxx11_(this,&context,dagChecker);
  cmGeneratorExpressionContext::~cmGeneratorExpressionContext(&context);
  return psVar1;
}

Assistant:

const std::string& cmCompiledGeneratorExpression::Evaluate(
  cmLocalGenerator* lg, const std::string& config,
  const cmGeneratorTarget* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const cmGeneratorTarget* currentTarget, std::string const& language) const
{
  cmGeneratorExpressionContext context(
    lg, config, this->Quiet, headTarget,
    currentTarget ? currentTarget : headTarget, this->EvaluateForBuildsystem,
    this->Backtrace, language);

  return this->EvaluateWithContext(context, dagChecker);
}